

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::AddCacheEntry(cmake *this,string *key,char *value,char *helpString,int type)

{
  bool bVar1;
  pointer this_00;
  pointer pcVar2;
  bool local_59;
  bool local_39;
  int type_local;
  char *helpString_local;
  char *value_local;
  string *key_local;
  cmake *this_local;
  
  this_00 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  cmState::AddCacheEntry(this_00,key,value,helpString,type);
  UnwatchUnusedCli(this,key);
  bVar1 = std::operator==(key,"CMAKE_WARN_DEPRECATED");
  if (bVar1) {
    pcVar2 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                       (&this->Messenger);
    local_39 = false;
    if (value != (char *)0x0) {
      local_39 = cmSystemTools::IsOff(value);
    }
    cmMessenger::SetSuppressDeprecatedWarnings(pcVar2,local_39);
  }
  else {
    bVar1 = std::operator==(key,"CMAKE_ERROR_DEPRECATED");
    if (bVar1) {
      pcVar2 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                         (&this->Messenger);
      bVar1 = cmSystemTools::IsOn(value);
      cmMessenger::SetDeprecatedWarningsAsErrors(pcVar2,bVar1);
    }
    else {
      bVar1 = std::operator==(key,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
      if (bVar1) {
        pcVar2 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                           (&this->Messenger);
        bVar1 = cmSystemTools::IsOn(value);
        cmMessenger::SetSuppressDevWarnings(pcVar2,bVar1);
      }
      else {
        bVar1 = std::operator==(key,"CMAKE_SUPPRESS_DEVELOPER_ERRORS");
        if (bVar1) {
          pcVar2 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                             (&this->Messenger);
          local_59 = false;
          if (value != (char *)0x0) {
            local_59 = cmSystemTools::IsOff(value);
          }
          cmMessenger::SetDevWarningsAsErrors(pcVar2,local_59);
        }
      }
    }
  }
  return;
}

Assistant:

void cmake::AddCacheEntry(const std::string& key, const char* value,
                          const char* helpString, int type)
{
  this->State->AddCacheEntry(key, value, helpString,
                             cmStateEnums::CacheEntryType(type));
  this->UnwatchUnusedCli(key);

  if (key == "CMAKE_WARN_DEPRECATED") {
    this->Messenger->SetSuppressDeprecatedWarnings(
      value && cmSystemTools::IsOff(value));
  } else if (key == "CMAKE_ERROR_DEPRECATED") {
    this->Messenger->SetDeprecatedWarningsAsErrors(cmSystemTools::IsOn(value));
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_WARNINGS") {
    this->Messenger->SetSuppressDevWarnings(cmSystemTools::IsOn(value));
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_ERRORS") {
    this->Messenger->SetDevWarningsAsErrors(value &&
                                            cmSystemTools::IsOff(value));
  }
}